

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TagAliasRegistry::add(TagAliasRegistry *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  domain_error *pdVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar8;
  ostringstream oss;
  allocator local_292;
  allocator local_291;
  SourceLineInfo *local_290;
  TagAliasRegistry *local_288;
  undefined1 local_280 [32];
  _Alloc_hider local_260;
  size_type local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  size_t local_240;
  string local_230;
  string local_210;
  SourceLineInfo local_1f0;
  string local_1c8;
  undefined1 local_1a8 [24];
  char local_190 [16];
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  size_t local_160;
  
  local_288 = this;
  std::__cxx11::string::string((string *)local_1a8,alias,&local_291);
  pcVar1 = local_280 + 0x10;
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"[@","");
  bVar4 = startsWith((string *)local_1a8,(string *)local_280);
  bVar5 = true;
  local_290 = lineInfo;
  if (bVar4) {
    std::__cxx11::string::string((string *)&local_230,alias,&local_292);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"]","");
    bVar5 = endsWith(&local_230,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    lineInfo = local_290;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    bVar5 = !bVar5;
  }
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"error: tag alias, \"",0x13);
    poVar6 = std::operator<<((ostream *)local_1a8,alias);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\" is not of the form [@alias name].\n",0x24);
    operator<<(poVar6,local_290);
    pdVar7 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::domain_error::domain_error(pdVar7,(char *)local_280._0_8_);
    __cxa_throw(pdVar7,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  std::__cxx11::string::string((string *)&local_1c8,tag,(allocator *)&local_230);
  paVar2 = &local_1f0.file.field_2;
  pcVar3 = (lineInfo->file)._M_dataplus._M_p;
  local_1f0.file._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar3,pcVar3 + (lineInfo->file)._M_string_length);
  local_1f0.line = lineInfo->line;
  TagAlias::TagAlias((TagAlias *)local_280,&local_1c8,&local_1f0);
  if ((char *)local_280._0_8_ == pcVar1) {
    local_190[8] = local_280[0x18];
    local_190[9] = local_280[0x19];
    local_190[10] = local_280[0x1a];
    local_190[0xb] = local_280[0x1b];
    local_190[0xc] = local_280[0x1c];
    local_190[0xd] = local_280[0x1d];
    local_190[0xe] = local_280[0x1e];
    local_190[0xf] = local_280[0x1f];
    local_1a8._8_8_ = local_190;
  }
  else {
    local_1a8._8_8_ = local_280._0_8_;
  }
  local_1a8._16_8_ = local_280._8_8_;
  local_280._8_8_ = 0;
  local_280[0x10] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_p == &local_250) {
    local_170._8_8_ = local_250._8_8_;
    local_180._M_p = (pointer)&local_170;
  }
  else {
    local_180._M_p = local_260._M_p;
  }
  local_178 = local_258;
  local_258 = 0;
  local_250._M_local_buf[0] = '\0';
  local_160 = local_240;
  local_280._0_8_ = pcVar1;
  local_260._M_p = (pointer)&local_250;
  local_1a8._0_8_ = alias;
  pVar8 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
          ::_M_emplace_unique<std::pair<char_const*,Catch::TagAlias>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                      *)&local_288->m_registry,(pair<const_char_*,_Catch::TagAlias> *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    operator_delete(local_180._M_p);
  }
  if ((char *)local_1a8._8_8_ != local_190) {
    operator_delete((void *)local_1a8._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_p != &local_250) {
    operator_delete(local_260._M_p);
  }
  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
    operator_delete((void *)local_280._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"error: tag alias, \"",0x13);
  poVar6 = std::operator<<((ostream *)local_1a8,alias);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" already registered.\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tFirst seen at ",0xf);
  std::__cxx11::string::string((string *)&local_230,alias,(allocator *)&local_210);
  (*(local_288->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(local_280,local_288,&local_230)
  ;
  operator<<(poVar6,(SourceLineInfo *)(local_280._0_8_ + 0x20));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tRedefined at ",0xe);
  operator<<(poVar6,local_290);
  Option<Catch::TagAlias>::reset((Option<Catch::TagAlias> *)local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  pdVar7 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(pdVar7,(char *)local_280._0_8_);
  __cxa_throw(pdVar7,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void TagAliasRegistry::add( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, "]" ) ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n" << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at " << find(alias)->lineInfo << "\n"
                << "\tRedefined at " << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
    }